

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTSDA.cpp
# Opt level: O1

void __thiscall chrono::ChLinkTSDA::ArchiveOUT(ChLinkTSDA *this,ChArchiveOut *marchive)

{
  ChArchiveOut::VersionWrite<chrono::ChLinkTSDA>(marchive);
  ChLink::ArchiveOUT(&this->super_ChLink,marchive);
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive);
  return;
}

Assistant:

void ChLinkTSDA::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkTSDA>();

    // serialize parent class
    ChLink::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(m_rest_length);
}